

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReReloop.cpp
# Opt level: O0

void wasm::ReReloop::BlockTask::handle(ReReloop *parent,Block *curr)

{
  Name name;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  bool bVar2;
  element_type *peVar3;
  Block *pBVar4;
  size_t sVar5;
  undefined1 local_88 [44];
  int i;
  ExpressionList *list;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 local_28 [8];
  shared_ptr<wasm::ReReloop::BlockTask> task;
  Block *curr_local;
  ReReloop *parent_local;
  
  task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)curr;
  bVar2 = IString::is(&(curr->name).super_IString);
  if (bVar2) {
    std::make_shared<wasm::ReReloop::BlockTask,wasm::ReReloop&,wasm::Block*&>
              ((ReReloop *)local_28,(Block **)parent);
    _Var1 = task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
    peVar3 = std::
             __shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    peVar3->curr = (Block *)_Var1._M_pi;
    pBVar4 = makeCFGBlock(parent);
    peVar3 = std::
             __shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    peVar3->later = pBVar4;
    local_48 = task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi[1]._vptr__Sp_counted_base;
    uStack_40 = *(undefined8 *)
                 &task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[1]._M_use_count;
    peVar3 = std::
             __shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
    name.super_IString.str._M_str = (char *)uStack_40;
    name.super_IString.str._M_len = local_48;
    addBreakTarget(parent,name,peVar3->later);
    std::shared_ptr<wasm::ReReloop::Task>::shared_ptr<wasm::ReReloop::BlockTask,void>
              ((shared_ptr<wasm::ReReloop::Task> *)&list,
               (shared_ptr<wasm::ReReloop::BlockTask> *)local_28);
    std::
    vector<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
    ::push_back(&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)&list);
    std::shared_ptr<wasm::ReReloop::Task>::~shared_ptr((shared_ptr<wasm::ReReloop::Task> *)&list);
    std::shared_ptr<wasm::ReReloop::BlockTask>::~shared_ptr
              ((shared_ptr<wasm::ReReloop::BlockTask> *)local_28);
  }
  register0x00000000 =
       task.super___shared_ptr<wasm::ReReloop::BlockTask,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi + 2;
  sVar5 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::size
                    ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                     register0x00000000);
  local_88._36_4_ = (undefined4)sVar5;
  while (local_88._36_4_ = local_88._36_4_ + -1, -1 < (int)local_88._36_4_) {
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
              ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
               stack0xffffffffffffffa0,(long)(int)local_88._36_4_);
    std::make_shared<wasm::ReReloop::TriageTask,wasm::ReReloop&,wasm::Expression*&>
              ((ReReloop *)local_88,(Expression **)parent);
    std::shared_ptr<wasm::ReReloop::Task>::shared_ptr<wasm::ReReloop::TriageTask,void>
              ((shared_ptr<wasm::ReReloop::Task> *)(local_88 + 0x10),
               (shared_ptr<wasm::ReReloop::TriageTask> *)local_88);
    std::
    vector<std::shared_ptr<wasm::ReReloop::Task>,_std::allocator<std::shared_ptr<wasm::ReReloop::Task>_>_>
    ::push_back(&parent->stack,(shared_ptr<wasm::ReReloop::Task> *)(local_88 + 0x10));
    std::shared_ptr<wasm::ReReloop::Task>::~shared_ptr
              ((shared_ptr<wasm::ReReloop::Task> *)(local_88 + 0x10));
    std::shared_ptr<wasm::ReReloop::TriageTask>::~shared_ptr
              ((shared_ptr<wasm::ReReloop::TriageTask> *)local_88);
  }
  return;
}

Assistant:

static void handle(ReReloop& parent, Block* curr) {
      if (curr->name.is()) {
        // we may be branched to. create a target, and
        // ensure we are called at the join point
        auto task = std::make_shared<BlockTask>(parent, curr);
        task->curr = curr;
        task->later = parent.makeCFGBlock();
        parent.addBreakTarget(curr->name, task->later);
        parent.stack.push_back(task);
      }
      auto& list = curr->list;
      for (int i = int(list.size()) - 1; i >= 0; i--) {
        parent.stack.push_back(std::make_shared<TriageTask>(parent, list[i]));
      }
    }